

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O0

void __thiscall fasttext::AutotuneStrategy::updateBest(AutotuneStrategy *this,Args *args)

{
  int iVar1;
  Args *in_RSI;
  Args *in_RDI;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 in_ZMM0 [64];
  vector<int,_std::allocator<int>_> *in_stack_00000020;
  int in_stack_0000002c;
  AutotuneStrategy *in_stack_00000030;
  
  auVar3 = in_ZMM0._0_16_;
  Args::operator=(in_RSI,in_RDI);
  iVar1 = getIndex(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
  *(int *)((long)&in_RDI[1].manualArgs_._M_h._M_before_begin._M_nxt + 4) = iVar1;
  auVar3 = vcvtusi2sd_avx512f(auVar3,in_RSI->dsub);
  dVar2 = log2(auVar3._0_8_);
  *(int *)&in_RDI[1].manualArgs_._M_h._M_element_count = (int)dVar2;
  if (in_RSI->bucket != 0) {
    *(int *)((long)&in_RDI[1].manualArgs_._M_h._M_element_count + 4) = in_RSI->bucket;
  }
  return;
}

Assistant:

void AutotuneStrategy::updateBest(const Args& args) {
  bestArgs_ = args;
  bestMinnIndex_ = getIndex(args.minn, minnChoices_);
  bestDsubExponent_ = log2(args.dsub);
  if (args.bucket != 0) {
    bestNonzeroBucket_ = args.bucket;
  }
}